

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O0

int pt_enc_get_offset(pt_encoder *encoder,uint64_t *offset)

{
  uint8_t *puVar1;
  uint8_t *begin;
  uint8_t *raw;
  uint64_t *offset_local;
  pt_encoder *encoder_local;
  
  if ((encoder == (pt_encoder *)0x0) || (offset == (uint64_t *)0x0)) {
    encoder_local._4_4_ = -2;
  }
  else if (encoder->pos == (uint8_t *)0x0) {
    encoder_local._4_4_ = -1;
  }
  else {
    puVar1 = (encoder->config).begin;
    if (puVar1 == (uint8_t *)0x0) {
      encoder_local._4_4_ = -1;
    }
    else {
      *offset = (long)encoder->pos - (long)puVar1;
      encoder_local._4_4_ = 0;
    }
  }
  return encoder_local._4_4_;
}

Assistant:

int pt_enc_get_offset(const struct pt_encoder *encoder, uint64_t *offset)
{
	const uint8_t *raw, *begin;

	if (!encoder || !offset)
		return -pte_invalid;

	/* The encoder is synchronized at all times. */
	raw = encoder->pos;
	if (!raw)
		return -pte_internal;

	begin = encoder->config.begin;
	if (!begin)
		return -pte_internal;

	*offset = (uint64_t) (int64_t) (raw - begin);
	return 0;
}